

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeSampledImageType(Builder *this,Id imageType)

{
  int iVar1;
  Id IVar2;
  size_type sVar3;
  reference ppIVar4;
  Instruction *this_00;
  undefined4 in_register_00000034;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48 [3];
  int local_2c;
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  Builder *pBStack_18;
  Id imageType_local;
  Builder *this_local;
  
  size = CONCAT44(in_register_00000034,imageType);
  local_2c = 0;
  type._4_4_ = imageType;
  pBStack_18 = this;
  while( true ) {
    iVar1 = local_2c;
    sVar3 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(this->groupedTypes + 0x1b);
    if ((int)sVar3 <= iVar1) {
      this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
      IVar2 = getUniqueId(this);
      Instruction::Instruction(this_00,IVar2,0,OpTypeSampledImage);
      pIStack_28 = this_00;
      Instruction::addIdOperand(this_00,type._4_4_);
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedTypes + 0x1b,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_48,
                 pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (local_48);
      Module::mapInstruction(&this->module,pIStack_28);
      IVar2 = Instruction::getResultId(pIStack_28);
      return IVar2;
    }
    ppIVar4 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](this->groupedTypes + 0x1b,(long)local_2c);
    pIStack_28 = *ppIVar4;
    size = 0;
    IVar2 = Instruction::getIdOperand(pIStack_28,0);
    if (IVar2 == type._4_4_) break;
    local_2c = local_2c + 1;
  }
  IVar2 = Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::makeSampledImageType(Id imageType)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeSampledImage].size(); ++t) {
        type = groupedTypes[OpTypeSampledImage][t];
        if (type->getIdOperand(0) == imageType)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeSampledImage);
    type->addIdOperand(imageType);

    groupedTypes[OpTypeSampledImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}